

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O2

bool __thiscall Js::RecyclableObject::HasAnySpecialProperties(RecyclableObject *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  DynamicObject *this_00;
  DynamicTypeHandler *this_01;
  CustomExternalWrapperObject *pCVar3;
  byte bVar4;
  
  bVar2 = DynamicType::Is(((this->type).ptr)->typeId);
  bVar4 = 1;
  if (bVar2) {
    this_00 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(this);
    this_01 = DynamicObject::GetTypeHandler(this_00);
    bVar2 = DynamicTypeHandler::GetHasSpecialProperties(this_01);
    if (!bVar2) {
      bVar2 = DynamicObject::HasObjectArray(this_00);
      if ((bVar2) && (bVar2 = HasAnySpecialProperties((RecyclableObject *)this_00->field_1), bVar2))
      {
        return true;
      }
      pp_Var1 = (this_00->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
      if ((pp_Var1 == (_func_int **)VirtualTableInfo<Js::CustomExternalWrapperObject>::Address) ||
         (pp_Var1 ==
          (_func_int **)
          VirtualTableInfo<Js::CrossSiteObject<Js::CustomExternalWrapperObject>_>::Address)) {
        pCVar3 = UnsafeVarTo<Js::CustomExternalWrapperObject,Js::DynamicObject>(this_00);
        bVar4 = pCVar3->initialized ^ 1;
      }
      else {
        bVar4 = 0;
      }
    }
  }
  return (bool)bVar4;
}

Assistant:

bool RecyclableObject::HasAnySpecialProperties()
    {
        if (DynamicType::Is(this->GetTypeId()))
        {
            DynamicObject* obj = UnsafeVarTo<DynamicObject>(this);
            return obj->GetTypeHandler()->GetHasSpecialProperties() ||
                (obj->HasObjectArray() && obj->GetObjectArrayOrFlagsAsArray()->HasAnySpecialProperties())
#ifdef _CHAKRACOREBUILD
                || (VarIs<CustomExternalWrapperObject>(obj) && !UnsafeVarTo<CustomExternalWrapperObject>(obj)->IsInitialized())
#endif
                ;
        }

        return true;
    }